

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_term(nn_sock *self)

{
  int iVar1;
  char *pcVar2;
  long in_RDI;
  nn_ctx *unaff_retaddr;
  int i;
  int rc;
  int in_stack_ffffffffffffffdc;
  nn_efd *in_stack_ffffffffffffffe0;
  FILE *pFVar3;
  nn_sem *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  do {
    iVar1 = nn_sem_wait(in_stack_ffffffffffffffe8);
  } while (iVar1 == -4);
  if (iVar1 == 0) {
    do {
      iVar1 = nn_sem_wait(in_stack_ffffffffffffffe8);
    } while (iVar1 == -4);
    if (iVar1 == 0) {
      nn_ctx_enter((nn_ctx *)0x2ed633);
      nn_ctx_leave(unaff_retaddr);
      if ((*(uint *)(*(long *)(in_RDI + 0x68) + 8) & 1) == 0) {
        nn_efd_term(in_stack_ffffffffffffffe0);
      }
      if ((*(uint *)(*(long *)(in_RDI + 0x68) + 8) & 2) == 0) {
        nn_efd_term(in_stack_ffffffffffffffe0);
      }
      nn_fsm_stopped_noevent((nn_fsm *)0x2ed695);
      nn_fsm_term((nn_fsm *)0x2ed69f);
      nn_sem_term((nn_sem *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      nn_list_term((nn_list *)0x2ed6c1);
      nn_list_term((nn_list *)0x2ed6d2);
      nn_ctx_term((nn_ctx *)0x2ed6e0);
      for (iVar1 = 0; iVar1 != 4; iVar1 = iVar1 + 1) {
        if (*(long *)(in_RDI + 0x170 + (long)iVar1 * 8) != 0) {
          (**(code **)**(undefined8 **)(in_RDI + 0x170 + (long)iVar1 * 8))
                    (*(undefined8 *)(in_RDI + 0x170 + (long)iVar1 * 8));
        }
      }
      return 0;
    }
    nn_backtrace_print();
    pFVar3 = _stderr;
    pcVar2 = nn_err_strerror(in_stack_ffffffffffffffdc);
    fprintf(pFVar3,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-iVar1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
            ,0xd5);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_backtrace_print();
  pFVar3 = _stderr;
  pcVar2 = nn_err_strerror(in_stack_ffffffffffffffdc);
  fprintf(pFVar3,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-iVar1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
          ,0xcc);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_sock_term (struct nn_sock *self)
{
    int rc;
    int i;

    /*  NOTE: nn_sock_stop must have already been called. */

    /*  Some endpoints may still be alive.  Here we are going to wait
        till they are all closed.  This loop is not interruptible, because
        making it so would leave a partially cleaned up socket, and we don't
        have a way to defer resource deallocation. */
    for (;;) {
        rc = nn_sem_wait (&self->termsem);
        if (nn_slow (rc == -EINTR))
            continue;
        errnum_assert (rc == 0, -rc);
        break;
    }

    /*  Also, wait for all holds on the socket to be released.  */
    for (;;) {
        rc = nn_sem_wait (&self->relesem);
        if (nn_slow (rc == -EINTR))
            continue;
        errnum_assert (rc == 0, -rc);
        break;
    }

    /*  Threads that posted the semaphore(s) can still have the ctx locked
        for a short while. By simply entering the context and exiting it
        immediately we can be sure that any such threads have already
        exited the context. */
    nn_ctx_enter (&self->ctx);
    nn_ctx_leave (&self->ctx);

    /*  At this point, we can be reasonably certain that no other thread
        has any references to the socket. */

    /*  Close the event FDs entirely. */
    if (!(self->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)) {
        nn_efd_term (&self->rcvfd);
    }
    if (!(self->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)) {
        nn_efd_term (&self->sndfd);
    }

    nn_fsm_stopped_noevent (&self->fsm);
    nn_fsm_term (&self->fsm);
    nn_sem_term (&self->termsem);
    nn_list_term (&self->sdeps);
    nn_list_term (&self->eps);
    nn_ctx_term (&self->ctx);

    /*  Destroy any optsets associated with the socket. */
    for (i = 0; i != NN_MAX_TRANSPORT; ++i)
        if (self->optsets [i])
            self->optsets [i]->vfptr->destroy (self->optsets [i]);

    return 0;
}